

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O1

int array_list_put_idx(array_list *arr,size_t idx,void *data)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = -1;
  if (idx != 0xffffffffffffffff) {
    iVar2 = array_list_expand_internal(arr,idx + 1);
    if (iVar2 == 0) {
      if ((idx < arr->length) && (arr->array[idx] != (void *)0x0)) {
        (*arr->free_fn)(arr->array[idx]);
      }
      arr->array[idx] = data;
      uVar1 = arr->length;
      if (uVar1 <= idx && idx - uVar1 != 0) {
        memset(arr->array + uVar1,0,(idx - uVar1) * 8);
      }
      iVar3 = 0;
      if (arr->length <= idx) {
        arr->length = idx + 1;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int array_list_put_idx(struct array_list *arr, size_t idx, void *data)
{
	if (idx > SIZE_T_MAX - 1)
		return -1;
	if (array_list_expand_internal(arr, idx + 1))
		return -1;
	if (idx < arr->length && arr->array[idx])
		arr->free_fn(arr->array[idx]);
	arr->array[idx] = data;
	if (idx > arr->length)
	{
		/* Zero out the arraylist slots in between the old length
		   and the newly added entry so we know those entries are
		   empty.
		   e.g. when setting array[7] in an array that used to be 
		   only 5 elements longs, array[5] and array[6] need to be
		   set to 0.
		 */
		memset(arr->array + arr->length, 0, (idx - arr->length) * sizeof(void *));
	}
	if (arr->length <= idx)
		arr->length = idx + 1;
	return 0;
}